

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

BCReg const_num(FuncState *fs,ExpDesc *e)

{
  BCReg BVar1;
  TValue *pTVar2;
  TValue TVar3;
  
  pTVar2 = lj_tab_set(fs->L,fs->kt,(cTValue *)e);
  if ((pTVar2->field_4).it == 0) {
    BVar1 = (pTVar2->u32).lo;
  }
  else {
    TVar3.field_4.it = 0;
    TVar3.field_4.i = fs->nkn;
    *pTVar2 = TVar3;
    BVar1 = fs->nkn;
    fs->nkn = BVar1 + 1;
  }
  return BVar1;
}

Assistant:

static BCReg const_num(FuncState *fs, ExpDesc *e)
{
  lua_State *L = fs->L;
  TValue *o;
  lj_assertFS(expr_isnumk(e), "bad usage");
  o = lj_tab_set(L, fs->kt, &e->u.nval);
  if (tvhaskslot(o))
    return tvkslot(o);
  o->u64 = fs->nkn;
  return fs->nkn++;
}